

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * getchainstates(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff918;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff920;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  allocator<char> *in_stack_fffffffffffff958;
  iterator in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff968;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff97f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff980;
  RPCExamples *pRVar1;
  string *in_stack_fffffffffffff988;
  RPCExamples *pRVar2;
  RPCResult *in_stack_fffffffffffff990;
  RPCResults *in_stack_fffffffffffff998;
  RPCResult *in_stack_fffffffffffff9a0;
  string *psVar3;
  string *local_658;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *name;
  RPCHelpMan *this_00;
  undefined1 local_550 [35];
  allocator<char> local_52d;
  allocator<char> local_52c;
  allocator<char> local_52b [33];
  allocator<char> local_50a;
  allocator<char> local_509 [31];
  allocator<char> local_4ea;
  allocator<char> local_4e9;
  _Alloc_hider local_4e8;
  size_type sStack_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  allocator<char> local_4c2;
  allocator<char> local_4c1 [31];
  allocator<char> local_4a2;
  allocator<char> local_4a1 [25];
  undefined8 local_488;
  RPCMethodImpl *fun;
  allocator<char> local_46a;
  allocator<char> local_469 [321];
  RPCExamples local_328 [4];
  RPCExamples local_2a0 [4];
  string local_220 [4];
  string local_198 [4];
  string local_110 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_488 = 0;
  fun = (RPCMethodImpl *)0x0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  local_4e8._M_p = (pointer)0x0;
  sStack_4e0 = 0;
  local_4d8._M_allocated_capacity = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff918);
  RPCResult::RPCResult
            (in_stack_fffffffffffff9a0,(Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
             (string *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980
             ,(bool)in_stack_fffffffffffff97f);
  psVar3 = local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  pRVar2 = local_328;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (in_stack_fffffffffffff970,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff968);
  RPCResult::RPCResult
            (in_stack_fffffffffffff9a0,(Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
             (string *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980
             ,(bool)in_stack_fffffffffffff97f);
  pRVar1 = local_328;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)0x1;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff918);
  __l._M_len = (size_type)in_stack_fffffffffffff968;
  __l._M_array = in_stack_fffffffffffff960;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff958,__l,
             (allocator_type *)in_stack_fffffffffffff950);
  RPCResult::RPCResult
            (in_stack_fffffffffffff9a0,(Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
             (string *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980
             ,(bool)in_stack_fffffffffffff97f);
  name = local_220;
  this_00 = (RPCHelpMan *)0x2;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff918);
  __l_00._M_len = (size_type)in_stack_fffffffffffff968;
  __l_00._M_array = in_stack_fffffffffffff960;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff958,__l_00,
             (allocator_type *)in_stack_fffffffffffff950);
  RPCResult::RPCResult
            (in_stack_fffffffffffff9a0,(Type)((ulong)in_stack_fffffffffffff998 >> 0x20),
             (string *)in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980
             ,(bool)in_stack_fffffffffffff97f);
  RPCResults::RPCResults(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  HelpExampleCli(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  HelpExampleRpc(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  std::operator+(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff918,(string *)0x129cad0);
  this = (RPCResult *)local_550;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getchainstates()::__0,void>(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  RPCHelpMan::RPCHelpMan(this_00,name,psVar3,args,(RPCResults *)pRVar1,pRVar2,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_550 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_52d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_52c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_52b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff928);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  psVar3 = local_220;
  local_658 = local_110;
  do {
    local_658 = (string *)((long)&local_658[-5].field_2 + 8);
    RPCResult::~RPCResult(this);
  } while (local_658 != psVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff928);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  pRVar2 = local_328;
  pRVar1 = local_2a0;
  do {
    pRVar1 = (RPCExamples *)((long)&pRVar1[-5].m_examples.field_2 + 8);
    RPCResult::~RPCResult(this);
  } while (pRVar1 != pRVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_50a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_509);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_4ea);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_4e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_4c2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_4c1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_4a2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_4a1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff928);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_46a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_469);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchainstates()
{
return RPCHelpMan{
        "getchainstates",
        "\nReturn information about chainstates.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::NUM, "headers", "the number of headers seen so far"},
                {RPCResult::Type::ARR, "chainstates", "list of the chainstates ordered by work, with the most-work (active) chainstate last", {{RPCResult::Type::OBJ, "", "", RPCHelpForChainstate},}},
            }
        },
        RPCExamples{
            HelpExampleCli("getchainstates", "")
    + HelpExampleRpc("getchainstates", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    LOCK(cs_main);
    UniValue obj(UniValue::VOBJ);

    ChainstateManager& chainman = EnsureAnyChainman(request.context);

    auto make_chain_data = [&](const Chainstate& cs, bool validated) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        AssertLockHeld(::cs_main);
        UniValue data(UniValue::VOBJ);
        if (!cs.m_chain.Tip()) {
            return data;
        }
        const CChain& chain = cs.m_chain;
        const CBlockIndex* tip = chain.Tip();

        data.pushKV("blocks",                (int)chain.Height());
        data.pushKV("bestblockhash",         tip->GetBlockHash().GetHex());
        data.pushKV("difficulty", GetDifficulty(*tip));
        data.pushKV("verificationprogress",  GuessVerificationProgress(Params().TxData(), tip));
        data.pushKV("coins_db_cache_bytes",  cs.m_coinsdb_cache_size_bytes);
        data.pushKV("coins_tip_cache_bytes", cs.m_coinstip_cache_size_bytes);
        if (cs.m_from_snapshot_blockhash) {
            data.pushKV("snapshot_blockhash", cs.m_from_snapshot_blockhash->ToString());
        }
        data.pushKV("validated", validated);
        return data;
    };

    obj.pushKV("headers", chainman.m_best_header ? chainman.m_best_header->nHeight : -1);

    const auto& chainstates = chainman.GetAll();
    UniValue obj_chainstates{UniValue::VARR};
    for (Chainstate* cs : chainstates) {
      obj_chainstates.push_back(make_chain_data(*cs, !cs->m_from_snapshot_blockhash || chainstates.size() == 1));
    }
    obj.pushKV("chainstates", std::move(obj_chainstates));
    return obj;
}